

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

value scope_export(scope sp)

{
  value pvVar1;
  set_cb_iterate_args in_RDI;
  value export;
  scope_export_cb_iterator_type export_iterator;
  scope in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  set_cb_iterate in_stack_fffffffffffffff8;
  
  scope_size(in_stack_ffffffffffffffd8);
  pvVar1 = value_create_map(in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8);
  if (pvVar1 == (value)0x0) {
    pvVar1 = (value)0x0;
  }
  else {
    value_to_map((value)0x129577);
    set_iterate((set)export,in_stack_fffffffffffffff8,in_RDI);
  }
  return pvVar1;
}

Assistant:

value scope_export(scope sp)
{
	struct scope_export_cb_iterator_type export_iterator;

	value export = value_create_map(NULL, scope_size(sp));

	if (export == NULL)
	{
		return NULL;
	}

	export_iterator.iterator = 0;
	export_iterator.values = value_to_map(export);

	set_iterate(sp->objects, &scope_export_cb_iterate, (set_cb_iterate_args)&export_iterator);

	return export;
}